

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_gme.cpp
# Opt level: O3

bool GMESong::Read(SoundStream *stream,void *buff,int len,void *userdata)

{
  FCriticalSection *this;
  int iVar1;
  gme_err_t pcVar2;
  
  this = (FCriticalSection *)((long)userdata + 0x18);
  FCriticalSection::Enter(this);
  iVar1 = gme_track_ended(*(Music_Emu **)((long)userdata + 0x20));
  if (iVar1 != 0) {
    if (*(char *)((long)userdata + 0xc) != '\x01') {
      memset(buff,0,(long)len);
      FCriticalSection::Leave(this);
      return false;
    }
    StartTrack((GMESong *)userdata,*(int *)((long)userdata + 0x34),false);
  }
  pcVar2 = gme_play(*(Music_Emu **)((long)userdata + 0x20),len >> 1,(short *)buff);
  FCriticalSection::Leave(this);
  return pcVar2 == (gme_err_t)0x0;
}

Assistant:

bool GMESong::Read(SoundStream *stream, void *buff, int len, void *userdata)
{
	gme_err_t err;
	GMESong *song = (GMESong *)userdata;

	song->CritSec.Enter();
	if (gme_track_ended(song->Emu))
	{
		if (song->m_Looping)
		{
			song->StartTrack(song->CurrTrack, false);
		}
		else
		{
			memset(buff, 0, len);
			song->CritSec.Leave();
			return false;
		}
	}
	err = gme_play(song->Emu, len >> 1, (short *)buff);
	song->CritSec.Leave();
	return (err == NULL);
}